

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

uintptr_t http_sse_subscribe(http_sse_s *sse_,http_sse_subscribe_args args)

{
  _func_void_http_sse_s_ptr *p_Var1;
  size_t *psVar2;
  subscription_s *psVar3;
  _func_void_http_sse_s_ptr *p_Var4;
  int *piVar5;
  long lVar6;
  undefined8 *puVar7;
  undefined8 *puVar8;
  char *format;
  byte bVar9;
  subscribe_args_s in_stack_ffffffffffffff58;
  fio_lock_i ret;
  undefined4 local_58 [2];
  size_t local_50;
  size_t sStack_48;
  char *local_40;
  fio_match_fn local_38;
  code *local_30;
  code *local_28;
  http_sse_s *local_20;
  size_t *local_18;
  
  bVar9 = 0;
  if (sse_[1].on_open == (_func_void_http_sse_s_ptr *)0xffffffffffffffff) {
    return 0;
  }
  if (args.on_message == (_func_void_http_sse_s_ptr_fio_str_info_s_fio_str_info_s_void_ptr *)0x0) {
    args.on_message = http_sse_on_message__direct;
  }
  psVar2 = (size_t *)fio_malloc(0x38);
  if (psVar2 == (size_t *)0x0) {
    if (FIO_LOG_LEVEL < 1) goto LAB_001405fb;
    format = 
    "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/http/http.c:1283"
    ;
  }
  else {
    psVar2[6] = (size_t)args.match;
    psVar2[4] = (size_t)args.on_unsubscribe;
    psVar2[5] = (size_t)args.udata;
    psVar2[2] = (size_t)args.channel.data;
    psVar2[3] = (size_t)args.on_message;
    *psVar2 = args.channel.capa;
    psVar2[1] = args.channel.len;
    LOCK();
    sse_[2].on_shutdown = sse_[2].on_shutdown + 1;
    UNLOCK();
    local_58[0] = 0;
    local_50 = args.channel.capa;
    sStack_48 = args.channel.len;
    local_40 = args.channel.data;
    local_38 = args.match;
    local_30 = http_sse_on_message;
    local_28 = http_sse_on_unsubscribe;
    local_20 = sse_;
    local_18 = psVar2;
    puVar7 = (undefined8 *)local_58;
    puVar8 = (undefined8 *)&stack0xffffffffffffff58;
    for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
      *puVar8 = *puVar7;
      puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
      puVar8 = puVar8 + (ulong)bVar9 * -2 + 1;
    }
    psVar3 = fio_subscribe(in_stack_ffffffffffffff58);
    if (psVar3 == (subscription_s *)0x0) {
      return 0;
    }
    fio_lock((fio_lock_i *)&sse_[2].on_ready);
    p_Var4 = (_func_void_http_sse_s_ptr *)calloc(0x18,1);
    if (p_Var4 != (_func_void_http_sse_s_ptr *)0x0) {
      p_Var1 = sse_[1].on_close;
      *(_func_void_http_sse_s_ptr **)p_Var4 = p_Var1;
      *(_func_void_http_sse_s_ptr ***)(p_Var4 + 8) = &sse_[1].on_close;
      *(subscription_s **)(p_Var4 + 0x10) = psVar3;
      *(_func_void_http_sse_s_ptr **)(p_Var1 + 8) = p_Var4;
      sse_[1].on_close = p_Var4;
      LOCK();
      *(undefined1 *)&sse_[2].on_ready = 0;
      UNLOCK();
      return (uintptr_t)p_Var4;
    }
    if (FIO_LOG_LEVEL < 1) goto LAB_001405fb;
    format = 
    "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fio.h:3313"
    ;
  }
  FIO_LOG2STDERR(format);
LAB_001405fb:
  kill(0,2);
  piVar5 = __errno_location();
  exit(*piVar5);
}

Assistant:

uintptr_t http_sse_subscribe(http_sse_s *sse_,
                             struct http_sse_subscribe_args args) {
  http_sse_internal_s *sse = FIO_LS_EMBD_OBJ(http_sse_internal_s, sse, sse_);
  if (sse->uuid == -1)
    return 0;
  if (!args.on_message)
    args.on_message = http_sse_on_message__direct;
  struct http_sse_subscribe_args *udata = fio_malloc(sizeof(*udata));
  FIO_ASSERT_ALLOC(udata);
  *udata = args;

  fio_atomic_add(&sse->ref, 1);
  subscription_s *sub =
      fio_subscribe(.channel = args.channel, .on_message = http_sse_on_message,
                    .on_unsubscribe = http_sse_on_unsubscribe, .udata1 = sse,
                    .udata2 = udata, .match = args.match);
  if (!sub)
    return 0;

  fio_lock(&sse->lock);
  fio_ls_s *pos = fio_ls_push(&sse->subscriptions, sub);
  fio_unlock(&sse->lock);
  return (uintptr_t)pos;
}